

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

Constant * add_constant(Proc *proc,Constant *c)

{
  C_MemoryAllocator *pCVar1;
  undefined8 uVar2;
  SetEntry *pSVar3;
  Constant *c1_1;
  Constant *c1;
  C_MemoryAllocator *allocator;
  int reg;
  SetEntry *entry;
  Constant *c_local;
  Proc *proc_local;
  
  pSVar3 = raviX_set_search(proc->constants,c);
  if (pSVar3 == (SetEntry *)0x0) {
    if (c->type == 8) {
      allocator._4_2_ = proc->num_intconstants;
      proc->num_intconstants = allocator._4_2_ + 1;
    }
    else if (c->type == 0x10) {
      allocator._4_2_ = proc->num_fltconstants;
      proc->num_fltconstants = allocator._4_2_ + 1;
    }
    else {
      if (c->type != 0x101) {
        __assert_fail("c->type == RAVI_TSTRING",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                      ,0x152,"const Constant *add_constant(Proc *, const Constant *)");
      }
      allocator._4_2_ = proc->num_strconstants;
      proc->num_strconstants = allocator._4_2_ + 1;
    }
    pCVar1 = proc->linearizer->compiler_state->allocator;
    proc_local = (Proc *)(*pCVar1->calloc)(pCVar1->arena,1,0x10);
    uVar2._0_2_ = c->type;
    uVar2._2_2_ = c->index;
    uVar2._4_4_ = *(undefined4 *)&c->field_0x4;
    proc_local->node_count = (int)uVar2;
    proc_local->allocated = (int)((ulong)uVar2 >> 0x20);
    proc_local->nodes = (BasicBlock **)c->field_2;
    *(uint16_t *)((long)&proc_local->node_count + 2) = allocator._4_2_;
    raviX_set_add(proc->constants,proc_local);
  }
  else {
    proc_local = (Proc *)pSVar3->key;
  }
  return (Constant *)proc_local;
}

Assistant:

static const Constant *add_constant(Proc *proc, const Constant *c)
{
	SetEntry *entry = raviX_set_search(proc->constants, c);
	if (entry == NULL) {
		int reg = 0;
		/* Assign each type of constant a different range so that if backend
		 * doesn't need to emit the regnum for a particular type it can do so.
		 * If backend needs to emit all constants then 2 of the 3 ranges can
		 * easily adjusted.
		 */
		switch(c->type) {
		case RAVI_TNUMINT:
			reg = proc->num_intconstants++;
			break;
		case RAVI_TNUMFLT:
			reg = proc->num_fltconstants++;
			break;
		default:
			assert(c->type == RAVI_TSTRING);
			reg = proc->num_strconstants++;
			break;
		}
		C_MemoryAllocator *allocator = proc->linearizer->compiler_state->allocator;
		Constant *c1 = (Constant *) allocator->calloc(allocator->arena, 1, sizeof(Constant));
		memcpy(c1, c, sizeof(Constant));
		c1->index = reg;
		raviX_set_add(proc->constants, c1);
		return c1;
	} else {
		const Constant *c1 = (Constant *) entry->key;
		return c1;
	}
}